

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  undefined1 *puVar1;
  byte bVar2;
  secp256k1_strauss_point_state *psVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined4 extraout_EAX;
  int iVar41;
  uint uVar42;
  uint uVar43;
  uint32_t uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  secp256k1_gej *psVar50;
  secp256k1_gej *psVar51;
  secp256k1_gej *psVar52;
  secp256k1_gej *psVar53;
  secp256k1_gej *r_00;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  secp256k1_gej *extraout_RDX_01;
  secp256k1_fe *extraout_RDX_02;
  secp256k1_fe *extraout_RDX_03;
  secp256k1_scalar *r_01;
  secp256k1_scalar *r_02;
  long lVar59;
  secp256k1_gej *psVar60;
  long lVar61;
  undefined1 *puVar62;
  secp256k1_gej *psVar63;
  uint64_t *puVar64;
  secp256k1_fe *psVar65;
  secp256k1_gej *r_03;
  secp256k1_fe *r_04;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  secp256k1_gej *psVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  secp256k1_ge *psVar78;
  uint uVar79;
  secp256k1_gej *psVar80;
  secp256k1_fe *psVar81;
  bool bVar82;
  byte bVar83;
  undefined1 auVar84 [16];
  secp256k1_scalar na_lam;
  secp256k1_fe Z;
  secp256k1_scalar ng_128;
  secp256k1_scalar ng_1;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_fe sStack_978;
  secp256k1_fe sStack_940;
  secp256k1_fe sStack_910;
  secp256k1_gej *psStack_8e0;
  secp256k1_gej *psStack_8d8;
  secp256k1_gej *psStack_8d0;
  secp256k1_gej *psStack_8c8;
  secp256k1_gej *psStack_8c0;
  secp256k1_gej *psStack_8b8;
  secp256k1_gej *psStack_8a8;
  secp256k1_gej sStack_8a0;
  secp256k1_gej sStack_808;
  secp256k1_ge sStack_770;
  secp256k1_gej *psStack_708;
  secp256k1_gej *psStack_700;
  secp256k1_gej *psStack_6f8;
  secp256k1_gej *psStack_6f0;
  secp256k1_gej *psStack_6e8;
  secp256k1_gej *psStack_6e0;
  uint uStack_6cc;
  int iStack_6c8;
  uint uStack_6c4;
  secp256k1_gej *psStack_6c0;
  undefined1 auStack_6b8 [24];
  uint64_t uStack_6a0;
  secp256k1_gej *psStack_690;
  secp256k1_gej *psStack_688;
  secp256k1_gej *psStack_680;
  secp256k1_gej *psStack_678;
  secp256k1_gej *psStack_670;
  code *pcStack_668;
  secp256k1_gej *psStack_660;
  secp256k1_gej *psStack_658;
  undefined1 auStack_650 [64];
  byte abStack_610 [32];
  byte abStack_5f0 [32];
  undefined1 auStack_5d0 [16];
  uint64_t uStack_5c0;
  uint64_t uStack_5b8;
  undefined1 auStack_5b0 [16];
  uint64_t uStack_5a0;
  uint64_t uStack_598;
  secp256k1_gej *psStack_588;
  secp256k1_gej *psStack_580;
  secp256k1_gej *psStack_578;
  secp256k1_gej *psStack_570;
  secp256k1_gej *psStack_568;
  secp256k1_scalar *psStack_560;
  secp256k1_gej *local_558;
  secp256k1_gej *local_550;
  secp256k1_gej *local_548;
  uint64_t *local_540;
  secp256k1_gej *local_538;
  long local_530;
  long local_528;
  secp256k1_ge local_520;
  undefined1 local_4b8 [24];
  undefined1 local_4a0 [16];
  undefined8 local_490;
  secp256k1_scalar local_488;
  secp256k1_scalar local_468;
  secp256k1_scalar local_448 [16];
  secp256k1_gej local_238 [3];
  
  bVar83 = 0;
  local_4b8._0_8_ = 1;
  local_4b8._8_16_ = (undefined1  [16])0x0;
  local_4a0 = (undefined1  [16])0x0;
  local_490._0_4_ = 1;
  local_490._4_4_ = 1;
  psStack_560 = (secp256k1_scalar *)0x146ed5;
  psVar50 = a;
  psVar71 = (secp256k1_gej *)na;
  local_540 = ng->d;
  local_538 = r;
  secp256k1_fe_verify((secp256k1_fe *)local_4b8);
  if (num == 0) {
    local_558 = (secp256k1_gej *)0x0;
    psVar51 = (secp256k1_gej *)0x0;
  }
  else {
    psVar51 = (secp256k1_gej *)0x0;
    psVar80 = local_238;
    local_558 = (secp256k1_gej *)0x0;
    do {
      psStack_560 = (secp256k1_scalar *)0x146ef8;
      secp256k1_scalar_verify(na);
      auVar84._0_4_ =
           -(uint)((int)(((secp256k1_gej *)na)->x).n[2] == 0 &&
                  (int)(((secp256k1_gej *)na)->x).n[0] == 0);
      auVar84._4_4_ =
           -(uint)(*(int *)((long)(((secp256k1_gej *)na)->x).n + 0x14) == 0 &&
                  *(int *)((long)(((secp256k1_gej *)na)->x).n + 4) == 0);
      auVar84._8_4_ =
           -(uint)((int)(((secp256k1_gej *)na)->x).n[3] == 0 &&
                  (int)(((secp256k1_gej *)na)->x).n[1] == 0);
      auVar84._12_4_ =
           -(uint)(*(int *)((long)(((secp256k1_gej *)na)->x).n + 0x1c) == 0 &&
                  *(int *)((long)(((secp256k1_gej *)na)->x).n + 0xc) == 0);
      iVar41 = movmskps(extraout_EAX,auVar84);
      if (iVar41 != 0xf) {
        psStack_560 = (secp256k1_scalar *)0x146f25;
        secp256k1_gej_verify(a);
        if (a->infinity == 0) {
          psStack_560 = (secp256k1_scalar *)0x146f48;
          secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)&local_520,na);
          r_02 = (secp256k1_scalar *)((long)psVar51 * 0x410);
          psStack_560 = (secp256k1_scalar *)0x146f72;
          local_550 = psVar51;
          iVar41 = secp256k1_ecmult_wnaf(state->ps[(long)psVar51].wnaf_na_1,0x81,local_448,5);
          psVar53 = (secp256k1_gej *)state->ps[(long)psVar51].wnaf_na_lam;
          state->ps[(long)psVar51].bits_na_1 = iVar41;
          psVar63 = (secp256k1_gej *)0x81;
          psStack_560 = (secp256k1_scalar *)0x146f9b;
          uVar42 = secp256k1_ecmult_wnaf((int *)psVar53,0x81,(secp256k1_scalar *)&local_520,5);
          psVar3 = state->ps;
          psVar3[(long)psVar51].bits_na_lam = uVar42;
          uVar79 = psVar3[(long)psVar51].bits_na_1;
          psVar50 = (secp256k1_gej *)(ulong)uVar79;
          if (0x81 < (int)uVar79) goto LAB_0014755a;
          if (0x81 < psVar3[(long)psVar51].bits_na_lam) goto LAB_0014755f;
          if ((int)uVar79 <= (int)local_558) {
            psVar50 = (secp256k1_gej *)((ulong)local_558 & 0xffffffff);
          }
          if ((int)psVar50 < (int)uVar42) {
            psVar50 = (secp256k1_gej *)(ulong)uVar42;
          }
          psStack_560 = (secp256k1_scalar *)0x146fef;
          local_558 = psVar50;
          memcpy(psVar80,a,0x98);
          psVar50 = (secp256k1_gej *)local_4b8;
          if (local_550 != (secp256k1_gej *)0x0) {
            psStack_560 = (secp256k1_scalar *)0x147010;
            secp256k1_gej_rescale(psVar80,(secp256k1_fe *)psVar50);
          }
          psVar51 = local_550;
          psStack_560 = (secp256k1_scalar *)0x14703e;
          psVar71 = psVar80;
          secp256k1_ecmult_odd_multiples_table
                    (8,state->pre_a + (long)local_550 * 8,state->aux + (long)local_550 * 8,
                     (secp256k1_fe *)psVar50,psVar80);
          if (psVar51 != (secp256k1_gej *)0x0) {
            psStack_560 = (secp256k1_scalar *)0x147062;
            secp256k1_fe_mul(state->aux + (long)psVar51 * 8,state->aux + (long)psVar51 * 8,&a->z);
          }
          psVar51 = (secp256k1_gej *)((long)(psVar51->x).n + 1);
        }
      }
      a = a + 1;
      na = (secp256k1_scalar *)((((secp256k1_gej *)na)->x).n + 4);
      num = (long)((secp256k1_scalar *)(num + -0x20))->d + 0x1f;
    } while ((secp256k1_scalar *)num != (secp256k1_scalar *)0x0);
  }
  local_550 = psVar51;
  if (psVar51 != (secp256k1_gej *)0x0) {
    psStack_560 = (secp256k1_scalar *)0x1470a8;
    secp256k1_ge_table_set_globalz((long)psVar51 * 8,state->pre_a,state->aux);
    lVar59 = 0;
    psVar51 = (secp256k1_gej *)0x0;
    psVar80 = (secp256k1_gej *)0x0;
    do {
      lVar61 = 0;
      local_548 = psVar51;
      do {
        psStack_560 = (secp256k1_scalar *)0x1470d6;
        secp256k1_fe_mul((secp256k1_fe *)((long)state->aux->n + lVar61 + lVar59),
                         (secp256k1_fe *)((long)(state->pre_a->x).n + (long)(psVar51->x).n),
                         &secp256k1_const_beta);
        psVar51 = (secp256k1_gej *)((psVar51->z).n + 1);
        lVar61 = lVar61 + 0x30;
      } while (lVar61 != 0x180);
      psVar80 = (secp256k1_gej *)((long)(psVar80->x).n + 1);
      psVar51 = (secp256k1_gej *)(local_548[5].y.n + 3);
      lVar59 = lVar59 + 0x180;
    } while (psVar80 != local_550);
  }
  if (local_540 == (uint64_t *)0x0) {
    local_528 = 0;
    local_530 = 0;
    uVar79 = (uint)local_558;
  }
  else {
    psStack_560 = (secp256k1_scalar *)0x147129;
    secp256k1_scalar_split_128(&local_468,&local_488,(secp256k1_scalar *)local_540);
    psStack_560 = (secp256k1_scalar *)0x147143;
    uVar42 = secp256k1_ecmult_wnaf((int *)local_238,0x81,&local_468,0xf);
    psVar50 = (secp256k1_gej *)0xf;
    psStack_560 = (secp256k1_scalar *)0x14715f;
    uVar43 = secp256k1_ecmult_wnaf((int *)local_448,0x81,&local_488,0xf);
    uVar79 = (uint)local_558;
    if ((int)(uint)local_558 < (int)uVar42) {
      uVar79 = uVar42;
    }
    if ((int)uVar79 < (int)uVar43) {
      uVar79 = uVar43;
    }
    local_530 = (long)(int)uVar43;
    local_528 = (long)(int)uVar42;
  }
  psVar53 = local_538;
  psStack_560 = (secp256k1_scalar *)0x1471a1;
  secp256k1_gej_set_infinity(local_538);
  if (0 < (int)uVar79) {
    psVar51 = (secp256k1_gej *)(ulong)uVar79;
    local_540 = (uint64_t *)((long)psVar51 * 4 - 4);
    local_558 = (secp256k1_gej *)state;
    do {
      psStack_560 = (secp256k1_scalar *)0x1471c9;
      secp256k1_gej_double_var(psVar53,psVar53,(secp256k1_fe *)0x0);
      local_548 = psVar51;
      psVar63 = psVar51;
      if (local_550 != (secp256k1_gej *)0x0) {
        psVar80 = (secp256k1_gej *)0x40c;
        a = (secp256k1_gej *)0x30;
        r_02 = (secp256k1_scalar *)0x0;
        num = (size_t)local_540;
        na = (secp256k1_scalar *)local_550;
        do {
          uVar4 = (((secp256k1_gej *)state)->x).n[2];
          psVar50 = (secp256k1_gej *)(long)*(int *)((long)(psVar80->x).n + (uVar4 - 4));
          if (((long)psVar63 <= (long)psVar50) && (uVar79 = *(uint *)(uVar4 + num), uVar79 != 0)) {
            if ((uVar79 & 1) == 0) {
              psStack_560 = (secp256k1_scalar *)0x147541;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_00147541:
              psStack_560 = (secp256k1_scalar *)0x147546;
              secp256k1_ecmult_strauss_wnaf_cold_8();
LAB_00147546:
              psStack_560 = (secp256k1_scalar *)0x14754b;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_0014754b:
              psStack_560 = (secp256k1_scalar *)0x147550;
              secp256k1_ecmult_strauss_wnaf_cold_6();
            }
            else {
              if ((int)uVar79 < -0xf) goto LAB_00147546;
              if ((int)uVar79 < 0x10) {
                uVar4 = (((secp256k1_gej *)state)->x).n[1];
                if ((int)uVar79 < 1) {
                  puVar64 = (uint64_t *)((long)&a->x + uVar4 + (ulong)(~uVar79 >> 1) * 0x68 + -0x30)
                  ;
                  psVar78 = &local_520;
                  for (lVar59 = 0xd; lVar59 != 0; lVar59 = lVar59 + -1) {
                    (psVar78->x).n[0] = *puVar64;
                    puVar64 = puVar64 + (ulong)bVar83 * -2 + 1;
                    psVar78 = (secp256k1_ge *)((long)psVar78 + ((ulong)bVar83 * -2 + 1) * 8);
                  }
                  psVar65 = &local_520.y;
                  psStack_560 = (secp256k1_scalar *)0x147289;
                  secp256k1_fe_verify(psVar65);
                  psStack_560 = (secp256k1_scalar *)0x147296;
                  secp256k1_fe_verify_magnitude(psVar65,1);
                  local_520.y.n[0] = 0x3ffffbfffff0bc - local_520.y.n[0];
                  local_520.y.n[1] = 0x3ffffffffffffc - local_520.y.n[1];
                  local_520.y.n[2] = 0x3ffffffffffffc - local_520.y.n[2];
                  local_520.y.n[3] = 0x3ffffffffffffc - local_520.y.n[3];
                  local_520.y.n[4] = 0x3fffffffffffc - local_520.y.n[4];
                  local_520.y.magnitude = 2;
                  local_520.y.normalized = 0;
                  psStack_560 = (secp256k1_scalar *)0x1472f4;
                  secp256k1_fe_verify(psVar65);
                  state = (secp256k1_strauss_state *)local_558;
                }
                else {
                  puVar64 = (uint64_t *)
                            ((long)&a->x + uVar4 + (ulong)(uVar79 - 1 >> 1) * 0x68 + -0x30);
                  psVar78 = &local_520;
                  for (lVar59 = 0xd; lVar59 != 0; lVar59 = lVar59 + -1) {
                    (psVar78->x).n[0] = *puVar64;
                    puVar64 = puVar64 + (ulong)bVar83 * -2 + 1;
                    psVar78 = (secp256k1_ge *)((long)psVar78 + ((ulong)bVar83 * -2 + 1) * 8);
                  }
                }
                psStack_560 = (secp256k1_scalar *)0x14730f;
                psVar53 = local_538;
                secp256k1_gej_add_ge_var(local_538,local_538,&local_520,(secp256k1_fe *)0x0);
                psVar63 = local_548;
                goto LAB_00147314;
              }
            }
            psStack_560 = (secp256k1_scalar *)0x147555;
            secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_00147555:
            psStack_560 = (secp256k1_scalar *)0x14755a;
            secp256k1_ecmult_strauss_wnaf_cold_7();
            goto LAB_0014755a;
          }
LAB_00147314:
          uVar4 = (((secp256k1_gej *)state)->x).n[2];
          psVar50 = (secp256k1_gej *)(long)*(int *)((long)(psVar80->x).n + uVar4);
          if (((long)psVar63 <= (long)psVar50) &&
             (uVar79 = *(uint *)(uVar4 + 0x204 + num), uVar79 != 0)) {
            if ((uVar79 & 1) == 0) goto LAB_00147541;
            if ((int)uVar79 < -0xf) goto LAB_0014754b;
            if ((int)uVar79 < 0x10) {
              uVar4 = (((secp256k1_gej *)state)->x).n[0];
              uVar5 = (((secp256k1_gej *)state)->x).n[1];
              if ((int)uVar79 < 1) {
                psStack_560 = (secp256k1_scalar *)0x1473b0;
                secp256k1_ge_set_xy(&local_520,
                                    (secp256k1_fe *)
                                    ((long)(&((secp256k1_gej *)r_02)->x)[~uVar79 >> 1].n + uVar4),
                                    (secp256k1_fe *)
                                    ((long)&a->x + (ulong)(~uVar79 >> 1) * 0x68 + uVar5));
                psStack_560 = (secp256k1_scalar *)0x1473ba;
                secp256k1_fe_verify(&local_520.y);
                psStack_560 = (secp256k1_scalar *)0x1473c9;
                secp256k1_fe_verify_magnitude(&local_520.y,1);
                local_520.y.n[0] = 0x3ffffbfffff0bc - local_520.y.n[0];
                local_520.y.n[1] = 0x3ffffffffffffc - local_520.y.n[1];
                local_520.y.n[2] = 0x3ffffffffffffc - local_520.y.n[2];
                local_520.y.n[3] = 0x3ffffffffffffc - local_520.y.n[3];
                local_520.y.n[4] = 0x3fffffffffffc - local_520.y.n[4];
                local_520.y.magnitude = 2;
                local_520.y.normalized = 0;
                psStack_560 = (secp256k1_scalar *)0x147429;
                secp256k1_fe_verify(&local_520.y);
              }
              else {
                uVar47 = (ulong)(uVar79 - 1 >> 1);
                psStack_560 = (secp256k1_scalar *)0x147382;
                secp256k1_ge_set_xy(&local_520,
                                    (secp256k1_fe *)
                                    ((long)(&((secp256k1_gej *)r_02)->x)[uVar47].n + uVar4),
                                    (secp256k1_fe *)((long)&a->x + uVar47 * 0x68 + uVar5));
              }
              psVar50 = (secp256k1_gej *)0x0;
              psStack_560 = (secp256k1_scalar *)0x14743b;
              psVar53 = local_538;
              secp256k1_gej_add_ge_var(local_538,local_538,&local_520,(secp256k1_fe *)0x0);
              psVar63 = local_548;
              state = (secp256k1_strauss_state *)local_558;
              goto LAB_00147444;
            }
            goto LAB_00147555;
          }
LAB_00147444:
          num = num + 0x410;
          psVar80 = (secp256k1_gej *)(psVar80[6].z.n + 4);
          a = (secp256k1_gej *)(a[5].y.n + 3);
          r_02 = (secp256k1_scalar *)((((secp256k1_gej *)((long)r_02 + 0x130))->y).n + 4);
          na = (secp256k1_scalar *)&((secp256k1_gej *)((long)na + -0x98))->field_0x97;
        } while (na != (secp256k1_scalar *)0x0);
      }
      psVar53 = local_538;
      psVar51 = (secp256k1_gej *)&psVar63[-1].field_0x97;
      if (((long)psVar63 <= local_528) &&
         (iVar41 = *(int *)((long)local_238[0].x.n + (long)psVar51 * 4), iVar41 != 0)) {
        psStack_560 = (secp256k1_scalar *)0x147495;
        secp256k1_ecmult_table_get_ge_storage(&local_520,secp256k1_pre_g,iVar41,(int)psVar50);
        state = (secp256k1_strauss_state *)local_558;
        psVar50 = (secp256k1_gej *)local_4b8;
        psStack_560 = (secp256k1_scalar *)0x1474af;
        secp256k1_gej_add_zinv_var(psVar53,psVar53,&local_520,(secp256k1_fe *)psVar50);
        psVar63 = local_548;
      }
      if (((long)psVar63 <= local_530) &&
         (iVar41 = *(int *)((long)local_448[0].d + (long)psVar51 * 4), iVar41 != 0)) {
        psStack_560 = (secp256k1_scalar *)0x1474da;
        secp256k1_ecmult_table_get_ge_storage(&local_520,secp256k1_pre_g_128,iVar41,(int)psVar50);
        state = (secp256k1_strauss_state *)local_558;
        psVar50 = (secp256k1_gej *)local_4b8;
        psStack_560 = (secp256k1_scalar *)0x1474f4;
        secp256k1_gej_add_zinv_var(psVar53,psVar53,&local_520,(secp256k1_fe *)psVar50);
        psVar63 = local_548;
      }
      local_540 = (uint64_t *)((long)local_540 - 4);
    } while (1 < (long)psVar63);
  }
  if (psVar53->infinity == 0) {
    psStack_560 = (secp256k1_scalar *)0x14752a;
    secp256k1_fe_mul(&psVar53->z,&psVar53->z,(secp256k1_fe *)local_4b8);
  }
  return;
LAB_0014755a:
  psStack_560 = (secp256k1_scalar *)0x14755f;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_0014755f:
  psStack_560 = (secp256k1_scalar *)secp256k1_scalar_split_lambda;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  pcStack_668 = (code *)0x147586;
  psVar51 = psVar63;
  r_03 = r_00;
  psStack_588 = (secp256k1_gej *)r_02;
  psStack_580 = (secp256k1_gej *)na;
  psStack_578 = a;
  psStack_570 = (secp256k1_gej *)state;
  psStack_568 = psVar80;
  psStack_560 = (secp256k1_scalar *)num;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if (psVar53 == r_00) {
    pcStack_668 = (code *)0x147ae7;
    secp256k1_scalar_split_lambda_cold_6();
LAB_00147ae7:
    pcStack_668 = (code *)0x147aec;
    secp256k1_scalar_split_lambda_cold_5();
LAB_00147aec:
    pcStack_668 = (code *)0x147af1;
    secp256k1_scalar_split_lambda_cold_4();
LAB_00147af1:
    pcStack_668 = (code *)0x147af6;
    secp256k1_scalar_split_lambda_cold_3();
LAB_00147af6:
    pcStack_668 = (code *)0x147afb;
    secp256k1_scalar_split_lambda_cold_1();
  }
  else {
    if (psVar63 == r_00) goto LAB_00147ae7;
    if (psVar53 == psVar63) goto LAB_00147aec;
    pcStack_668 = (code *)0x1475a9;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    pcStack_668 = (code *)0x1475b8;
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g1);
    uVar47 = (r_00->x).n[0];
    uVar48 = (r_00->x).n[1];
    uVar49 = (r_00->x).n[2];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar47;
    uVar54 = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),8);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar54;
    auStack_650._0_8_ = SUB168(auVar6 * ZEXT816(0xe893209a45dbb031),0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar47;
    auVar7 = auVar7 * ZEXT816(0x3daa8a1471e8ca7f);
    uVar66 = SUB168(auVar7 + auVar39,0);
    uVar72 = SUB168(auVar7 + auVar39,8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar48;
    uVar55 = SUB168(auVar8 * ZEXT816(0xe893209a45dbb031),8);
    uVar46 = SUB168(auVar8 * ZEXT816(0xe893209a45dbb031),0);
    auStack_650._8_8_ = uVar66 + uVar46;
    uVar46 = (ulong)CARRY8(uVar66,uVar46);
    uVar66 = uVar72 + uVar55;
    uVar73 = uVar66 + uVar46;
    uVar74 = (ulong)CARRY8(auVar7._8_8_,(ulong)CARRY8(uVar54,auVar7._0_8_)) +
             (ulong)(CARRY8(uVar72,uVar55) || CARRY8(uVar66,uVar46));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar47;
    uVar56 = SUB168(auVar9 * ZEXT816(0xe86c90e49284eb15),8);
    uVar46 = SUB168(auVar9 * ZEXT816(0xe86c90e49284eb15),0);
    uVar54 = uVar73 + uVar46;
    uVar46 = (ulong)CARRY8(uVar73,uVar46);
    uVar55 = uVar74 + uVar56;
    uVar75 = uVar55 + uVar46;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar48;
    uVar57 = SUB168(auVar10 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar66 = SUB168(auVar10 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar73 = uVar54 + uVar66;
    uVar66 = (ulong)CARRY8(uVar54,uVar66);
    uVar72 = uVar75 + uVar57;
    uVar76 = uVar72 + uVar66;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar49;
    uVar58 = SUB168(auVar11 * ZEXT816(0xe893209a45dbb031),8);
    uVar54 = SUB168(auVar11 * ZEXT816(0xe893209a45dbb031),0);
    auStack_650._16_8_ = uVar73 + uVar54;
    uVar54 = (ulong)CARRY8(uVar73,uVar54);
    uVar73 = uVar76 + uVar58;
    uVar77 = uVar73 + uVar54;
    uVar67 = (ulong)(CARRY8(uVar74,uVar56) || CARRY8(uVar55,uVar46)) +
             (ulong)(CARRY8(uVar75,uVar57) || CARRY8(uVar72,uVar66)) +
             (ulong)(CARRY8(uVar76,uVar58) || CARRY8(uVar73,uVar54));
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar47;
    uVar58 = SUB168(auVar12 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar47 = SUB168(auVar12 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar54 = uVar77 + uVar47;
    uVar46 = (ulong)CARRY8(uVar77,uVar47);
    uVar72 = uVar67 + uVar58;
    uVar77 = uVar72 + uVar46;
    uVar47 = (r_00->x).n[3];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar48;
    uVar74 = SUB168(auVar13 * ZEXT816(0xe86c90e49284eb15),8);
    uVar66 = SUB168(auVar13 * ZEXT816(0xe86c90e49284eb15),0);
    uVar55 = uVar54 + uVar66;
    uVar66 = (ulong)CARRY8(uVar54,uVar66);
    uVar73 = uVar77 + uVar74;
    uVar68 = uVar73 + uVar66;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar49;
    uVar75 = SUB168(auVar14 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar54 = SUB168(auVar14 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar57 = uVar55 + uVar54;
    uVar54 = (ulong)CARRY8(uVar55,uVar54);
    uVar56 = uVar68 + uVar75;
    uVar69 = uVar56 + uVar54;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar47;
    uVar76 = SUB168(auVar15 * ZEXT816(0xe893209a45dbb031),8);
    uVar55 = SUB168(auVar15 * ZEXT816(0xe893209a45dbb031),0);
    auStack_650._24_8_ = uVar57 + uVar55;
    uVar55 = (ulong)CARRY8(uVar57,uVar55);
    uVar57 = uVar69 + uVar76;
    uVar70 = uVar57 + uVar55;
    uVar58 = (ulong)(CARRY8(uVar67,uVar58) || CARRY8(uVar72,uVar46)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar73,uVar66)) +
             (ulong)(CARRY8(uVar68,uVar75) || CARRY8(uVar56,uVar54)) +
             (ulong)(CARRY8(uVar69,uVar76) || CARRY8(uVar57,uVar55));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar48;
    uVar73 = SUB168(auVar16 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar48 = SUB168(auVar16 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar66 = uVar70 + uVar48;
    uVar48 = (ulong)CARRY8(uVar70,uVar48);
    uVar54 = uVar58 + uVar73;
    uVar74 = uVar54 + uVar48;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar49;
    uVar56 = SUB168(auVar17 * ZEXT816(0xe86c90e49284eb15),8);
    uVar46 = SUB168(auVar17 * ZEXT816(0xe86c90e49284eb15),0);
    uVar72 = uVar66 + uVar46;
    uVar46 = (ulong)CARRY8(uVar66,uVar46);
    uVar55 = uVar74 + uVar56;
    uVar75 = uVar55 + uVar46;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar47;
    uVar57 = SUB168(auVar18 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar66 = SUB168(auVar18 * ZEXT816(0x3daa8a1471e8ca7f),0);
    auStack_650._32_8_ = uVar72 + uVar66;
    uVar66 = (ulong)CARRY8(uVar72,uVar66);
    uVar72 = uVar75 + uVar57;
    uVar76 = uVar72 + uVar66;
    uVar72 = (ulong)(CARRY8(uVar58,uVar73) || CARRY8(uVar54,uVar48)) +
             (ulong)(CARRY8(uVar74,uVar56) || CARRY8(uVar55,uVar46)) +
             (ulong)(CARRY8(uVar75,uVar57) || CARRY8(uVar72,uVar66));
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar49;
    uVar54 = SUB168(auVar19 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar48 = SUB168(auVar19 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar66 = uVar76 + uVar48;
    uVar48 = (ulong)CARRY8(uVar76,uVar48);
    uVar46 = uVar72 + uVar54;
    uVar73 = uVar46 + uVar48;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar47;
    uVar55 = SUB168(auVar20 * ZEXT816(0xe86c90e49284eb15),8);
    uVar49 = SUB168(auVar20 * ZEXT816(0xe86c90e49284eb15),0);
    auStack_650._40_8_ = uVar66 + uVar49;
    uVar49 = (ulong)CARRY8(uVar66,uVar49);
    uVar66 = uVar73 + uVar55;
    auStack_650._56_8_ =
         (ulong)(CARRY8(uVar72,uVar54) || CARRY8(uVar46,uVar48)) +
         (ulong)(CARRY8(uVar73,uVar55) || CARRY8(uVar66,uVar49));
    auStack_650._48_8_ = uVar66 + uVar49;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar47;
    auStack_650._48_16_ = auVar21 * ZEXT816(0x3086d221a7d46bcd) + auStack_650._48_16_;
    uStack_5c0 = 0;
    uStack_5b8 = 0;
    pcStack_668 = (code *)0x147738;
    psStack_660 = psVar53;
    psStack_658 = psVar63;
    auStack_5d0 = auStack_650._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_5d0,0,(uint)((ulong)auStack_650._40_8_ >> 0x3f));
    pcStack_668 = (code *)0x147740;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_5d0);
    pcStack_668 = (code *)0x147748;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    pcStack_668 = (code *)0x147757;
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g2);
    psVar53 = psStack_658;
    na = (secp256k1_scalar *)psStack_660;
    uVar47 = (r_00->x).n[0];
    uVar48 = (r_00->x).n[1];
    psVar50 = (secp256k1_gej *)(r_00->x).n[2];
    a = (secp256k1_gej *)0x6f547fa90abfe4c4;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar47;
    uVar66 = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),8);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar66;
    auStack_650._0_8_ = SUB168(auVar22 * ZEXT816(0x1571b4ae8ac47f71),0);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar47;
    auVar23 = auVar23 * ZEXT816(0x221208ac9df506c6);
    uVar46 = SUB168(auVar23 + auVar40,0);
    uVar55 = SUB168(auVar23 + auVar40,8);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar48;
    uVar54 = SUB168(auVar24 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar49 = SUB168(auVar24 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_650._8_8_ = uVar46 + uVar49;
    uVar49 = (ulong)CARRY8(uVar46,uVar49);
    uVar46 = uVar55 + uVar54;
    uVar72 = uVar46 + uVar49;
    uVar58 = (ulong)CARRY8(auVar23._8_8_,(ulong)CARRY8(uVar66,auVar23._0_8_)) +
             (ulong)(CARRY8(uVar55,uVar54) || CARRY8(uVar46,uVar49));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar47;
    uVar73 = SUB168(auVar25 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar49 = SUB168(auVar25 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar66 = uVar72 + uVar49;
    uVar49 = (ulong)CARRY8(uVar72,uVar49);
    uVar54 = uVar58 + uVar73;
    uVar74 = uVar54 + uVar49;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar48;
    uVar56 = SUB168(auVar26 * ZEXT816(0x221208ac9df506c6),8);
    uVar46 = SUB168(auVar26 * ZEXT816(0x221208ac9df506c6),0);
    uVar72 = uVar66 + uVar46;
    uVar46 = (ulong)CARRY8(uVar66,uVar46);
    uVar55 = uVar74 + uVar56;
    uVar75 = uVar55 + uVar46;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = psVar50;
    uVar57 = SUB168(auVar27 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar66 = SUB168(auVar27 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_650._16_8_ = uVar72 + uVar66;
    uVar66 = (ulong)CARRY8(uVar72,uVar66);
    uVar72 = uVar75 + uVar57;
    uVar67 = uVar72 + uVar66;
    uVar76 = (ulong)(CARRY8(uVar58,uVar73) || CARRY8(uVar54,uVar49)) +
             (ulong)(CARRY8(uVar74,uVar56) || CARRY8(uVar55,uVar46)) +
             (ulong)(CARRY8(uVar75,uVar57) || CARRY8(uVar72,uVar66));
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar47;
    uVar57 = SUB168(auVar28 * ZEXT816(0xe4437ed6010e8828),8);
    uVar47 = SUB168(auVar28 * ZEXT816(0xe4437ed6010e8828),0);
    uVar66 = uVar67 + uVar47;
    uVar49 = (ulong)CARRY8(uVar67,uVar47);
    uVar55 = uVar76 + uVar57;
    uVar67 = uVar55 + uVar49;
    uVar47 = (r_00->x).n[3];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar48;
    uVar58 = SUB168(auVar29 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar46 = SUB168(auVar29 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar54 = uVar66 + uVar46;
    uVar46 = (ulong)CARRY8(uVar66,uVar46);
    uVar72 = uVar67 + uVar58;
    uVar77 = uVar72 + uVar46;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = psVar50;
    uVar74 = SUB168(auVar30 * ZEXT816(0x221208ac9df506c6),8);
    uVar66 = SUB168(auVar30 * ZEXT816(0x221208ac9df506c6),0);
    uVar56 = uVar54 + uVar66;
    uVar66 = (ulong)CARRY8(uVar54,uVar66);
    uVar73 = uVar77 + uVar74;
    uVar68 = uVar73 + uVar66;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar47;
    uVar75 = SUB168(auVar31 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar54 = SUB168(auVar31 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_650._24_8_ = uVar56 + uVar54;
    uVar54 = (ulong)CARRY8(uVar56,uVar54);
    uVar56 = uVar68 + uVar75;
    uVar69 = uVar56 + uVar54;
    uVar57 = (ulong)(CARRY8(uVar76,uVar57) || CARRY8(uVar55,uVar49)) +
             (ulong)(CARRY8(uVar67,uVar58) || CARRY8(uVar72,uVar46)) +
             (ulong)(CARRY8(uVar77,uVar74) || CARRY8(uVar73,uVar66)) +
             (ulong)(CARRY8(uVar68,uVar75) || CARRY8(uVar56,uVar54));
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar48;
    uVar72 = SUB168(auVar32 * ZEXT816(0xe4437ed6010e8828),8);
    uVar48 = SUB168(auVar32 * ZEXT816(0xe4437ed6010e8828),0);
    uVar46 = uVar69 + uVar48;
    uVar48 = (ulong)CARRY8(uVar69,uVar48);
    uVar66 = uVar57 + uVar72;
    uVar58 = uVar66 + uVar48;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = psVar50;
    uVar73 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar49 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar55 = uVar46 + uVar49;
    uVar49 = (ulong)CARRY8(uVar46,uVar49);
    uVar54 = uVar58 + uVar73;
    uVar74 = uVar54 + uVar49;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar47;
    uVar56 = SUB168(auVar34 * ZEXT816(0x221208ac9df506c6),8);
    uVar46 = SUB168(auVar34 * ZEXT816(0x221208ac9df506c6),0);
    auStack_650._32_8_ = uVar55 + uVar46;
    uVar46 = (ulong)CARRY8(uVar55,uVar46);
    uVar55 = uVar74 + uVar56;
    uVar75 = uVar55 + uVar46;
    uVar72 = (ulong)(CARRY8(uVar57,uVar72) || CARRY8(uVar66,uVar48)) +
             (ulong)(CARRY8(uVar58,uVar73) || CARRY8(uVar54,uVar49)) +
             (ulong)(CARRY8(uVar74,uVar56) || CARRY8(uVar55,uVar46));
    auVar35._8_8_ = 0;
    auVar35._0_8_ = psVar50;
    uVar54 = SUB168(auVar35 * ZEXT816(0xe4437ed6010e8828),8);
    uVar48 = SUB168(auVar35 * ZEXT816(0xe4437ed6010e8828),0);
    uVar66 = uVar75 + uVar48;
    uVar48 = (ulong)CARRY8(uVar75,uVar48);
    uVar46 = uVar72 + uVar54;
    uVar73 = uVar46 + uVar48;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar47;
    uVar55 = SUB168(auVar36 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar49 = SUB168(auVar36 * ZEXT816(0x6f547fa90abfe4c4),0);
    auStack_650._40_8_ = uVar66 + uVar49;
    uVar49 = (ulong)CARRY8(uVar66,uVar49);
    uVar66 = uVar73 + uVar55;
    auVar38._8_8_ =
         (ulong)(CARRY8(uVar72,uVar54) || CARRY8(uVar46,uVar48)) +
         (ulong)(CARRY8(uVar73,uVar55) || CARRY8(uVar66,uVar49));
    auVar38._0_8_ = uVar66 + uVar49;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar47;
    auStack_650._48_16_ = auVar37 * ZEXT816(0xe4437ed6010e8828) + auVar38;
    psVar71 = auStack_650._56_8_;
    uStack_5a0 = 0;
    uStack_598 = 0;
    pcStack_668 = (code *)0x1478d7;
    auStack_5b0 = auStack_650._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_5b0,0,(uint)((ulong)auStack_650._40_8_ >> 0x3f));
    pcStack_668 = (code *)0x1478df;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_5b0);
    pcStack_668 = (code *)0x1478f9;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_5d0,(secp256k1_scalar *)auStack_5d0,
               &secp256k1_scalar_split_lambda::minus_b1);
    pcStack_668 = (code *)0x14790b;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_5b0,(secp256k1_scalar *)auStack_5b0,
               &secp256k1_scalar_split_lambda::minus_b2);
    pcStack_668 = (code *)0x147919;
    secp256k1_scalar_add
              ((secp256k1_scalar *)psVar53,(secp256k1_scalar *)auStack_5d0,
               (secp256k1_scalar *)auStack_5b0);
    r_02 = &secp256k1_const_lambda;
    pcStack_668 = (code *)0x14792e;
    secp256k1_scalar_mul(na,(secp256k1_scalar *)psVar53,&secp256k1_const_lambda);
    pcStack_668 = (code *)0x147939;
    secp256k1_scalar_negate(na,na);
    pcStack_668 = (code *)0x147947;
    secp256k1_scalar_add(na,na,(secp256k1_scalar *)r_00);
    pcStack_668 = (code *)0x14794f;
    secp256k1_scalar_verify(na);
    pcStack_668 = (code *)0x147957;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar53);
    psVar63 = (secp256k1_gej *)auStack_650;
    pcStack_668 = (code *)0x14796a;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)psVar63,&secp256k1_const_lambda,(secp256k1_scalar *)psVar53);
    pcStack_668 = (code *)0x147978;
    psVar51 = psVar63;
    secp256k1_scalar_add((secp256k1_scalar *)psVar63,(secp256k1_scalar *)psVar63,na);
    pcStack_668 = (code *)0x147980;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar63);
    pcStack_668 = (code *)0x147988;
    r_03 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if ((((auStack_650._0_8_ != (r_00->x).n[0]) || (auStack_650._8_8_ != (r_00->x).n[1])) ||
        (auStack_650._16_8_ != (r_00->x).n[2])) || (auStack_650._24_8_ != (r_00->x).n[3]))
    goto LAB_00147af1;
    r_02 = (secp256k1_scalar *)auStack_650;
    pcStack_668 = (code *)0x1479d2;
    secp256k1_scalar_negate(r_02,na);
    pcStack_668 = (code *)0x1479df;
    secp256k1_scalar_get_b32(abStack_5f0,na);
    pcStack_668 = (code *)0x1479ec;
    secp256k1_scalar_get_b32(abStack_610,r_02);
    psVar51 = (secp256k1_gej *)0x0;
    uVar47 = extraout_RDX;
    do {
      uVar48 = uVar47 & 0xffffffff;
      bVar83 = abStack_5f0[(long)psVar51];
      bVar2 = (byte)psVar51[0x2952].x.n[0];
      uVar47 = (ulong)((uint)bVar83 - (uint)bVar2);
      if (bVar83 == bVar2) {
        uVar47 = uVar48;
      }
      iVar41 = (int)uVar47;
      if (bVar83 != bVar2) goto LAB_00147a19;
      psVar51 = (secp256k1_gej *)((long)(psVar51->x).n + 1);
    } while (psVar51 != (secp256k1_gej *)0x20);
    iVar41 = 0;
LAB_00147a19:
    if (-1 < iVar41) {
      lVar59 = 0;
      do {
        psVar51 = (secp256k1_gej *)((ulong)psVar51 & 0xffffffff);
        bVar83 = abStack_610[lVar59];
        r_03 = (secp256k1_gej *)(ulong)bVar83;
        bVar2 = (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar59];
        psVar71 = (secp256k1_gej *)(ulong)bVar2;
        psVar50 = (secp256k1_gej *)(ulong)((uint)bVar83 - (uint)bVar2);
        if (bVar83 != bVar2) goto LAB_00147a43;
        lVar59 = lVar59 + 1;
      } while (lVar59 != 0x20);
      psVar50 = (secp256k1_gej *)0x0;
LAB_00147a43:
      if ((int)psVar50 < 0) goto LAB_00147a4b;
      goto LAB_00147af6;
    }
LAB_00147a4b:
    r_02 = (secp256k1_scalar *)auStack_650;
    pcStack_668 = (code *)0x147a5b;
    secp256k1_scalar_negate(r_02,(secp256k1_scalar *)psVar53);
    pcStack_668 = (code *)0x147a68;
    secp256k1_scalar_get_b32(abStack_5f0,(secp256k1_scalar *)psVar53);
    pcStack_668 = (code *)0x147a75;
    secp256k1_scalar_get_b32(abStack_610,r_02);
    psVar51 = (secp256k1_gej *)0x0;
    uVar47 = extraout_RDX_00;
    do {
      uVar48 = uVar47 & 0xffffffff;
      bVar83 = abStack_5f0[(long)psVar51];
      bVar2 = (byte)psVar51[0x2952].x.n[4];
      uVar47 = (ulong)((uint)bVar83 - (uint)bVar2);
      if (bVar83 == bVar2) {
        uVar47 = uVar48;
      }
      iVar41 = (int)uVar47;
      if (bVar83 != bVar2) goto LAB_00147aa2;
      psVar51 = (secp256k1_gej *)((long)(psVar51->x).n + 1);
    } while (psVar51 != (secp256k1_gej *)0x20);
    iVar41 = 0;
LAB_00147aa2:
    if (iVar41 < 0) {
      return;
    }
    lVar59 = 0;
    do {
      psVar51 = (secp256k1_gej *)((ulong)psVar51 & 0xffffffff);
      bVar83 = abStack_610[lVar59];
      r_03 = (secp256k1_gej *)(ulong)bVar83;
      bVar2 = (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar59];
      psVar71 = (secp256k1_gej *)(ulong)bVar2;
      psVar50 = (secp256k1_gej *)(ulong)((uint)bVar83 - (uint)bVar2);
      if (bVar83 != bVar2) goto LAB_00147acc;
      lVar59 = lVar59 + 1;
    } while (lVar59 != 0x20);
    psVar50 = (secp256k1_gej *)0x0;
LAB_00147acc:
    if ((int)psVar50 < 0) {
      return;
    }
  }
  pcStack_668 = secp256k1_ecmult_wnaf;
  secp256k1_scalar_split_lambda_cold_2();
  psVar80 = r_00;
  psStack_6c0 = r_03;
  psStack_690 = (secp256k1_gej *)r_02;
  psStack_688 = (secp256k1_gej *)na;
  psStack_680 = a;
  psStack_678 = psVar63;
  psStack_670 = psVar53;
  if (r_03 == (secp256k1_gej *)0x0) {
LAB_00147c99:
    psStack_6e0 = (secp256k1_gej *)0x147c9e;
    secp256k1_ecmult_wnaf_cold_5();
    psVar60 = (secp256k1_gej *)r_02;
LAB_00147c9e:
    psStack_6e0 = (secp256k1_gej *)0x147ca3;
    secp256k1_ecmult_wnaf_cold_4();
  }
  else {
    psVar60 = (secp256k1_gej *)r_02;
    psVar63 = extraout_RDX_01;
    if (extraout_RDX_01 == (secp256k1_gej *)0x0) goto LAB_00147c9e;
    uVar79 = (uint)psVar50;
    psVar60 = (secp256k1_gej *)((ulong)psVar50 & 0xffffffff);
    psVar63 = extraout_RDX_01;
    if (1 < (int)uVar79) {
      iVar41 = (int)psVar51;
      uVar47 = (ulong)psVar51 & 0xffffffff;
      psVar52 = psVar50;
      if (0 < iVar41) {
        psVar51 = (secp256k1_gej *)0x0;
        psStack_6e0 = (secp256k1_gej *)0x147b4b;
        memset(r_03,0,uVar47 << 2);
      }
      auStack_6b8._0_8_ = (extraout_RDX_01->x).n[0];
      auStack_6b8._8_8_ = (extraout_RDX_01->x).n[1];
      unique0x00006c80 = *(undefined1 (*) [16])((extraout_RDX_01->x).n + 2);
      psVar63 = (secp256k1_gej *)auStack_6b8;
      psStack_6e0 = (secp256k1_gej *)0x147b6a;
      r_03 = psVar63;
      secp256k1_scalar_verify((secp256k1_scalar *)psVar63);
      iStack_6c8 = 1;
      if ((long)uStack_6a0 < 0) {
        psVar51 = (secp256k1_gej *)auStack_6b8;
        psStack_6e0 = (secp256k1_gej *)0x147b86;
        r_03 = psVar51;
        secp256k1_scalar_negate((secp256k1_scalar *)psVar51,(secp256k1_scalar *)psVar51);
        iStack_6c8 = -1;
      }
      if (iVar41 < 1) {
        bVar82 = true;
        psVar53 = (secp256k1_gej *)0x0;
        psVar80 = (secp256k1_gej *)0x0;
        psVar50 = psVar52;
      }
      else {
        uStack_6c4 = uVar79 - 1;
        na = (secp256k1_scalar *)0x0;
        uStack_6cc = 0xffffffff;
        psVar80 = psVar51;
        psVar63 = (secp256k1_gej *)0x0;
        do {
          psVar51 = psVar63;
          r_03 = (secp256k1_gej *)auStack_6b8;
          psStack_6e0 = (secp256k1_gej *)0x147bb8;
          psVar63 = r_03;
          secp256k1_scalar_verify((secp256k1_scalar *)r_03);
          uVar42 = (uint)psVar51;
          bVar82 = (*(ulong *)(auStack_6b8 + ((ulong)psVar51 >> 6) * 8) >> ((ulong)psVar51 & 0x3f) &
                   1) != 0;
          psVar53 = (secp256k1_gej *)(ulong)bVar82;
          if ((uint)bVar82 == (uint)na) {
            uVar43 = uVar42 + 1;
            psVar51 = psVar80;
            r_03 = psVar63;
          }
          else {
            uVar43 = iVar41 - uVar42;
            if ((int)uVar79 <= (int)(iVar41 - uVar42)) {
              uVar43 = uVar79;
            }
            psStack_6e0 = (secp256k1_gej *)0x147bf4;
            uVar44 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)r_03,uVar42,uVar43);
            uVar45 = uVar44 + (uint)na;
            bVar82 = (uVar45 >> (uStack_6c4 & 0x1f) & 1) != 0;
            na = (secp256k1_scalar *)(ulong)bVar82;
            psVar53 = (secp256k1_gej *)(long)(int)uVar42;
            *(uint *)((long)(psStack_6c0->x).n + (long)psVar53 * 4) =
                 (uVar45 - ((uint)bVar82 << ((byte)psVar50 & 0x1f))) * iStack_6c8;
            uVar43 = uVar43 + uVar42;
            uStack_6cc = uVar42;
          }
          psVar63 = (secp256k1_gej *)(ulong)uVar43;
          a = (secp256k1_gej *)auStack_6b8;
          psVar80 = psVar51;
        } while ((int)uVar43 < iVar41);
        bVar82 = (int)na == 0;
        psVar80 = (secp256k1_gej *)(ulong)(uStack_6cc + 1);
        psVar50 = psVar53;
        psVar53 = psVar63;
      }
      if (bVar82) {
        if ((int)psVar53 < 0x100) {
          r_02 = (secp256k1_scalar *)auStack_6b8;
          do {
            psStack_6e0 = (secp256k1_gej *)0x147c66;
            r_03 = (secp256k1_gej *)r_02;
            secp256k1_scalar_verify(r_02);
            if ((*(ulong *)(auStack_6b8 + ((ulong)psVar53 >> 6) * 8) >> ((ulong)psVar53 & 0x3f) & 1)
                != 0) {
              psStack_6e0 = (secp256k1_gej *)0x147c99;
              secp256k1_ecmult_wnaf_cold_2();
              goto LAB_00147c99;
            }
            uVar79 = (int)psVar53 + 1;
            psVar53 = (secp256k1_gej *)(ulong)uVar79;
          } while (uVar79 != 0x100);
        }
        return;
      }
      goto LAB_00147ca8;
    }
  }
  psStack_6e0 = (secp256k1_gej *)0x147ca8;
  secp256k1_ecmult_wnaf_cold_3();
LAB_00147ca8:
  psStack_6e0 = (secp256k1_gej *)secp256k1_ecmult_odd_multiples_table;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_708 = psVar60;
  psStack_700 = (secp256k1_gej *)na;
  psStack_6f8 = a;
  psStack_6f0 = psVar63;
  psStack_6e8 = psVar53;
  psStack_6e0 = psVar80;
  if (psVar71->infinity == 0) {
    psStack_8b8 = (secp256k1_gej *)0x147cf1;
    psStack_8a8 = psVar50;
    secp256k1_gej_double_var(&sStack_808,psVar71,(secp256k1_fe *)0x0);
    psStack_8b8 = (secp256k1_gej *)0x147d09;
    secp256k1_ge_set_xy(&sStack_770,&sStack_808.x,&sStack_808.y);
    psStack_8b8 = (secp256k1_gej *)0x147d1f;
    secp256k1_ge_set_gej_zinv((secp256k1_ge *)psVar51,psVar71,&sStack_808.z);
    psStack_8b8 = (secp256k1_gej *)0x147d2c;
    secp256k1_gej_set_ge(&sStack_8a0,(secp256k1_ge *)psVar51);
    sStack_8a0.z.n[0] = (psVar71->z).n[0];
    sStack_8a0.z.n[1] = (psVar71->z).n[1];
    sStack_8a0.z.n[2] = (psVar71->z).n[2];
    sStack_8a0.z.n[3] = (psVar71->z).n[3];
    sStack_8a0.z.n[4] = (psVar71->z).n[4];
    sStack_8a0.z.magnitude = (psVar71->z).magnitude;
    sStack_8a0.z.normalized = (psVar71->z).normalized;
    extraout_RDX_02->n[4] = sStack_808.z.n[4];
    extraout_RDX_02->magnitude = sStack_808.z.magnitude;
    extraout_RDX_02->normalized = sStack_808.z.normalized;
    extraout_RDX_02->n[2] = sStack_808.z.n[2];
    extraout_RDX_02->n[3] = sStack_808.z.n[3];
    extraout_RDX_02->n[0] = sStack_808.z.n[0];
    extraout_RDX_02->n[1] = sStack_808.z.n[1];
    if (1 < (int)r_03) {
      lVar59 = ((ulong)r_03 & 0xffffffff) - 1;
      psVar65 = extraout_RDX_02;
      do {
        psVar51 = (secp256k1_gej *)((psVar51->z).n + 1);
        psVar65 = psVar65 + 1;
        psStack_8b8 = (secp256k1_gej *)0x147da0;
        secp256k1_gej_add_ge_var(&sStack_8a0,&sStack_8a0,&sStack_770,psVar65);
        psStack_8b8 = (secp256k1_gej *)0x147dae;
        secp256k1_ge_set_xy((secp256k1_ge *)psVar51,&sStack_8a0.x,&sStack_8a0.y);
        lVar59 = lVar59 + -1;
      } while (lVar59 != 0);
    }
    psStack_8b8 = (secp256k1_gej *)0x147dd2;
    secp256k1_fe_mul(&psStack_8a8->x,&sStack_8a0.z,&sStack_808.z);
    return;
  }
  psStack_8b8 = (secp256k1_gej *)secp256k1_ge_table_set_globalz;
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar50 = r_03;
  psVar71 = psVar51;
  psVar65 = extraout_RDX_03;
  psStack_8e0 = psVar60;
  psStack_8d8 = (secp256k1_gej *)na;
  psStack_8d0 = a;
  psStack_8c8 = psVar63;
  psStack_8c0 = psVar53;
  psStack_8b8 = psVar80;
  if (r_03 != (secp256k1_gej *)0x0) {
    do {
      secp256k1_ge_verify((secp256k1_ge *)psVar71);
      secp256k1_fe_verify(psVar65);
      psVar65 = psVar65 + 1;
      psVar80 = psVar50 + -1;
      psVar50 = (secp256k1_gej *)&psVar80->field_0x97;
      psVar71 = (secp256k1_gej *)((psVar71->z).n + 1);
    } while (&psVar80->field_0x97 != (undefined1 *)0x0);
    puVar1 = &r_03[-1].field_0x97;
    psVar81 = (secp256k1_fe *)((long)&psVar51->y + (long)puVar1 * 0x68);
    secp256k1_fe_verify(psVar81);
    uVar47 = *(ulong *)((long)&psVar51->z + (long)puVar1 * 0x68 + -0x10);
    uVar49 = (uVar47 >> 0x30) * 0x1000003d1 + psVar81->n[0];
    uVar48 = (uVar49 >> 0x34) + *(long *)((long)&psVar51->y + (long)puVar1 * 0x68 + 8);
    uVar46 = (uVar48 >> 0x34) + *(long *)((long)&psVar51->y + (long)puVar1 * 0x68 + 0x10);
    uVar66 = (uVar46 >> 0x34) + *(long *)((long)&psVar51->y + (long)puVar1 * 0x68 + 0x18);
    psVar65 = (secp256k1_fe *)(uVar46 & 0xfffffffffffff);
    psVar81->n[0] = uVar49 & 0xfffffffffffff;
    *(ulong *)((long)&psVar51->y + (long)puVar1 * 0x68 + 8) = uVar48 & 0xfffffffffffff;
    *(secp256k1_fe **)((long)&psVar51->y + (long)puVar1 * 0x68 + 0x10) = psVar65;
    *(ulong *)((long)&psVar51->y + (long)puVar1 * 0x68 + 0x18) = uVar66 & 0xfffffffffffff;
    *(ulong *)((long)&psVar51->z + (long)puVar1 * 0x68 + -0x10) =
         (uVar66 >> 0x34) + (uVar47 & 0xffffffffffff);
    *(undefined4 *)((long)&psVar51->z + (long)puVar1 * 0x68 + -8) = 1;
    secp256k1_fe_verify(psVar81);
    sStack_978.n[0] = extraout_RDX_03[(long)puVar1].n[0];
    sStack_978.n[1] = extraout_RDX_03[(long)puVar1].n[1];
    sStack_978.n[2] = extraout_RDX_03[(long)puVar1].n[2];
    sStack_978.n[3] = (extraout_RDX_03[(long)puVar1].n + 2)[1];
    sStack_978.n[4] = extraout_RDX_03[(long)puVar1].n[4];
    sStack_978._40_8_ = (extraout_RDX_03[(long)puVar1].n + 4)[1];
    if (puVar1 != (undefined1 *)0x0) {
      psVar78 = (secp256k1_ge *)((long)psVar51 + (long)r_03 * 0x68 + -0xd0);
      psVar81 = extraout_RDX_03 + (long)r_03;
      puVar62 = (undefined1 *)0x0;
      do {
        psVar81 = psVar81 + -1;
        if (puVar62 != (undefined1 *)0x0) {
          psVar65 = &sStack_978;
          secp256k1_fe_mul(&sStack_978,&sStack_978,psVar81);
        }
        secp256k1_ge_verify(psVar78);
        r_04 = &sStack_978;
        secp256k1_fe_verify(&sStack_978);
        if (psVar78->infinity != 0) {
          secp256k1_ge_table_set_globalz_cold_1();
          secp256k1_scalar_verify(r_01);
          r_04->n[0] = r_01->d[0];
          r_04->n[1] = r_01->d[1];
          r_04->n[2] = 0;
          r_04->n[3] = 0;
          psVar65->n[0] = r_01->d[2];
          psVar65->n[1] = r_01->d[3];
          psVar65->n[2] = 0;
          psVar65->n[3] = 0;
          secp256k1_scalar_verify((secp256k1_scalar *)r_04);
          secp256k1_scalar_verify((secp256k1_scalar *)psVar65);
          return;
        }
        secp256k1_fe_sqr(&sStack_910,&sStack_978);
        secp256k1_fe_mul(&sStack_940,&sStack_910,&sStack_978);
        secp256k1_fe_mul(&psVar78->x,&psVar78->x,&sStack_910);
        psVar65 = &psVar78->y;
        secp256k1_fe_mul(psVar65,psVar65,&sStack_940);
        secp256k1_ge_verify(psVar78);
        puVar62 = puVar62 + 1;
        psVar78 = psVar78 + -1;
      } while (puVar1 != puVar62);
    }
    do {
      secp256k1_ge_verify((secp256k1_ge *)psVar51);
      psVar51 = (secp256k1_gej *)((psVar51->z).n + 1);
      r_03 = (secp256k1_gej *)&r_03[-1].field_0x97;
    } while (r_03 != (secp256k1_gej *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}